

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsgf.c
# Opt level: O2

int expand_rule(jsgf_t *grammar,jsgf_rule_t *rule)

{
  glist_t *ppgVar1;
  jsgf_rhs_t *pjVar2;
  long lVar3;
  jsgf_atom_t *atom;
  char *__s1;
  glist_t pgVar4;
  jsgf_rule_t *pjVar5;
  int iVar6;
  int32 iVar7;
  glist_t pgVar8;
  jsgf_rhs_t **ppjVar9;
  char *pcVar10;
  char *pcVar11;
  size_t sVar12;
  size_t sVar13;
  gnode_s **ppgVar14;
  gnode_t *pgVar15;
  jsgf_rhs_t **ppjVar16;
  jsgf_rhs_t *pjVar17;
  uint from;
  float fVar18;
  jsgf_rule_t *local_50;
  undefined1 local_48 [16];
  
  ppgVar1 = &grammar->rulestack;
  pgVar8 = glist_add_ptr(grammar->rulestack,rule);
  grammar->rulestack = pgVar8;
  fVar18 = 0.0;
  ppjVar16 = &rule->rhs;
  ppjVar9 = ppjVar16;
  while (pjVar2 = *ppjVar9, pjVar2 != (jsgf_rhs_t *)0x0) {
    if (pjVar2->atoms != (glist_t)0x0) {
      fVar18 = fVar18 + *(float *)((pjVar2->atoms->data).i + 0x10);
    }
    ppjVar9 = &pjVar2->alt;
  }
  iVar6 = grammar->nstate;
  rule->entry = iVar6;
  grammar->nstate = iVar6 + 2;
  rule->exit = iVar6 + 1;
  local_48 = ZEXT416(~-(uint)(fVar18 == 0.0) & (uint)fVar18 | -(uint)(fVar18 == 0.0) & 0x3f800000);
  do {
    pjVar2 = *ppjVar16;
    if (pjVar2 == (jsgf_rhs_t *)0x0) {
      pgVar15 = gnode_free(*ppgVar1,(gnode_t *)0x0);
      *ppgVar1 = pgVar15;
      return rule->exit;
    }
    if (pjVar2->atoms != (glist_t)0x0) {
      lVar3 = (pjVar2->atoms->data).i;
      *(float *)(lVar3 + 0x10) = *(float *)(lVar3 + 0x10) / (float)local_48._0_4_;
    }
    from = rule->entry;
    pjVar17 = pjVar2;
    while (pgVar8 = pjVar17->atoms, pgVar8 != (glist_t)0x0) {
      atom = (jsgf_atom_t *)(pgVar8->data).ptr;
      __s1 = atom->name;
      if ((*__s1 == '<') && (iVar6 = strcmp(__s1,"<NULL>"), iVar6 != 0)) {
        iVar6 = strcmp(__s1,"<VOID>");
        if (iVar6 != 0) {
          pcVar10 = strchr(__s1 + 1,0x2e);
          if (pcVar10 == (char *)0x0) {
            pcVar10 = __ckd_salloc__(rule->name + 1,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                                     ,0xcc);
            pcVar11 = strrchr(pcVar10 + 1,0x2e);
            if (pcVar11 == (char *)0x0) {
              ckd_free(pcVar10);
            }
            else {
              *pcVar11 = '\0';
              if (pcVar10 != (char *)0x0) {
                sVar12 = strlen(pcVar10);
                sVar13 = strlen(__s1);
                pcVar11 = (char *)__ckd_malloc__(sVar12 + sVar13 + 4,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                                                 ,0xf6);
                sprintf(pcVar11,"<%s.%s",pcVar10,__s1 + 1);
                ckd_free(pcVar10);
                goto LAB_0012dd88;
              }
            }
            pcVar11 = __ckd_salloc__(__s1,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                                     ,0xf5);
          }
          else {
            pcVar11 = __ckd_salloc__(__s1,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                                     ,0xf1);
          }
LAB_0012dd88:
          iVar7 = hash_table_lookup(grammar->rules,pcVar11,&local_50);
          if (iVar7 == -1) {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                    ,0x13e,"Undefined rule in RHS: %s\n",pcVar11);
            ckd_free(pcVar11);
          }
          else {
            ckd_free(pcVar11);
            pjVar5 = local_50;
            ppgVar14 = ppgVar1;
            while (pgVar4 = *ppgVar14, pgVar4 != (glist_t)0x0) {
              ppgVar14 = &pgVar4->next;
              if ((jsgf_rule_t *)(pgVar4->data).ptr == local_50) {
                if (pgVar8->next != (gnode_s *)0x0) {
                  err_msg(ERR_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                          ,0x150,"Only right-recursion is permitted (in %s.%s)\n",grammar->name,
                          rule->name);
                  goto LAB_0012de23;
                }
                err_msg(ERR_INFO,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                        ,0x155,"Right recursion %s %d => %d\n",atom->name,(ulong)from,
                        local_50->entry);
                jsgf_add_link(grammar,atom,from,pjVar5->entry);
                from = 0xfffffffe;
                goto LAB_0012de6a;
              }
            }
            iVar6 = expand_rule(grammar,local_50);
            if (iVar6 != -1) {
              jsgf_add_link(grammar,atom,from,pjVar5->entry);
              from = pjVar5->exit;
              goto LAB_0012dcbc;
            }
          }
        }
LAB_0012de23:
        from = 0xffffffff;
        break;
      }
      jsgf_add_link(grammar,atom,from,grammar->nstate);
      from = grammar->nstate;
      grammar->nstate = from + 1;
LAB_0012dcbc:
      pjVar17 = (jsgf_rhs_t *)&pgVar8->next;
    }
LAB_0012de6a:
    if (from != 0xfffffffe) {
      if (from == 0xffffffff) {
        return -1;
      }
      jsgf_add_link(grammar,(jsgf_atom_t *)0x0,from,rule->exit);
    }
    ppjVar16 = &pjVar2->alt;
  } while( true );
}

Assistant:

static int
expand_rule(jsgf_t * grammar, jsgf_rule_t * rule)
{
    jsgf_rhs_t *rhs;
    float norm;

    /* Push this rule onto the stack */
    grammar->rulestack = glist_add_ptr(grammar->rulestack, rule);

    /* Normalize weights for all alternatives exiting rule->entry */
    norm = 0;
    for (rhs = rule->rhs; rhs; rhs = rhs->alt) {
        if (rhs->atoms) {
            jsgf_atom_t *atom = gnode_ptr(rhs->atoms);
            norm += atom->weight;
        }
    }

    rule->entry = grammar->nstate++;
    rule->exit = grammar->nstate++;
    if (norm == 0) norm = 1;
    for (rhs = rule->rhs; rhs; rhs = rhs->alt) {
        int lastnode;

        if (rhs->atoms) {
            jsgf_atom_t *atom = gnode_ptr(rhs->atoms);
	    atom->weight /= norm;
        }
        lastnode = expand_rhs(grammar, rule, rhs);
        if (lastnode == -1) {
            return -1;
        }
        else if (lastnode == RECURSION) {
            /* Do nothing. */
        }
        else {
            jsgf_add_link(grammar, NULL, lastnode, rule->exit);
        }
    }

    /* Pop this rule from the rule stack */
    grammar->rulestack = gnode_free(grammar->rulestack, NULL);
    return rule->exit;
}